

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# REFPROP_lib.h
# Opt level: O2

bool load_REFPROP(string *err,string *shared_library_path,string *shared_library_name)

{
  bool bVar1;
  long lVar2;
  string shared_lib;
  string msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  char rpv [1000];
  
  if (RefpropdllInstance != (void *)0x0) {
    return true;
  }
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  shared_lib._M_dataplus._M_p = (pointer)&shared_lib.field_2;
  shared_lib._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  shared_lib.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&shared_lib);
  RP_join_path((string *)rpv,shared_library_path,&shared_lib);
  RefpropdllInstance = (void *)dlopen(rpv._0_8_);
  std::__cxx11::string::~string((string *)rpv);
  if (RefpropdllInstance == (void *)0x0) {
    lVar2 = dlerror();
    if (lVar2 != 0) {
      std::__cxx11::string::assign((char *)&msg);
    }
  }
  else {
    RP_join_path((string *)rpv,shared_library_path,&shared_lib);
    std::__cxx11::string::operator=((string *)&RPPath_loaded_abi_cxx11_,(string *)rpv);
    std::__cxx11::string::~string((string *)rpv);
  }
  if (RefpropdllInstance == (void *)0x0) {
    std::operator+(&local_468,"Could not load REFPROP (",&shared_lib);
    std::operator+(&local_448,&local_468,") due to: ");
    std::operator+(&local_428,&local_448,&msg);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rpv,
                   &local_428,". ");
    std::__cxx11::string::operator=((string *)err,(string *)rpv);
    std::__cxx11::string::~string((string *)rpv);
    std::__cxx11::string::~string((string *)&local_428);
    std::__cxx11::string::~string((string *)&local_448);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::append((char *)err);
    std::__cxx11::string::append((char *)err);
  }
  else {
    bVar1 = setFunctionPointers(err);
    if (bVar1) {
      memset(rpv,0,1000);
      (*(code *)RPVersion)(rpv,1000);
      std::__cxx11::string::assign((char *)&RPVersion_loaded_abi_cxx11_);
      bVar1 = true;
      goto LAB_001056f6;
    }
    std::__cxx11::string::assign((char *)err);
  }
  bVar1 = false;
LAB_001056f6:
  std::__cxx11::string::~string((string *)&shared_lib);
  std::__cxx11::string::~string((string *)&msg);
  return bVar1;
}

Assistant:

bool load_REFPROP(std::string &err, const std::string &shared_library_path, const std::string &shared_library_name)
    {
        // If REFPROP is not loaded
        if (RefpropdllInstance == NULL)
        {
            // Load it
            std::string msg;
            std::string shared_lib;
            if (shared_library_name.empty()) 
            {
                shared_lib = get_shared_lib();
            } else {
                shared_lib = shared_library_name;
            }
            #if defined(__RPISWINDOWS__)
                // Load the DLL
                TCHAR refpropdllstring[_MAX_PATH];
                strcpy((char*)refpropdllstring, RP_join_path(shared_library_path, shared_lib).c_str());
                RefpropdllInstance = LoadLibrary(refpropdllstring);
                // Error handling
                if (RefpropdllInstance == NULL)
                {
                    std::stringstream msg_stream;
                    msg_stream << GetLastError(); // returns error
                    msg = msg_stream.str();
                } else {
                    TCHAR dllPath[_MAX_PATH];
                    HMODULE hModule;
                    hModule = GetModuleHandle(refpropdllstring);
                    GetModuleFileName(hModule, dllPath, _MAX_PATH);
                    #ifndef UNICODE
                        msg = dllPath;
                    #else
                        std::wstring wStr = dllPath;
                        msg = std::string(wStr.begin(), wStr.end());
                    #endif
                    RPPath_loaded = msg;
                }
            #elif ( defined(__RPISLINUX__) || defined(__RPISAPPLE__) )
                // Load library
                RefpropdllInstance = dlopen (RP_join_path(shared_library_path, shared_lib).c_str(), RTLD_NOW); 
                // Error handling
                if (RefpropdllInstance == NULL) 
                {
                    const char *errstr = dlerror();
                    if (errstr != NULL) 
                    {
                        msg = errstr;
                    }
                } else {
                    RPPath_loaded = RP_join_path(shared_library_path, shared_lib);
                }
            #else
                RefpropdllInstance = NULL;
                RPPath_loaded = "";
                msg = "Something is wrong with the platform definition, you should not end up here.";
            #endif

            if (RefpropdllInstance == NULL)
            {
                err = "Could not load REFPROP (" + shared_lib + ") due to: " + msg + ". ";
                err.append("Make sure the library is in your system search path. ");
                err.append("In case you run 64bit Windows and you have a REFPROP license, try installing the 64bit DLL from NIST. ");
                return false;
            }
            if (setFunctionPointers(err) != true)
            {
                err = "There was an error setting the REFPROP function pointers, check types and names in header file.";
                return false;
            }
            char rpv[versionstringlength] = { '\0' };
            RPVersion(rpv, versionstringlength);
            RPVersion_loaded = rpv;
            return true;
        }
        return true;
    }